

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<signed_char>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<signed_char> *accessor)

{
  DataChunk *pDVar1;
  char cVar2;
  CURSOR *pCVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  char input;
  char input_00;
  char input_01;
  double dVar8;
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar3 = accessor->data;
  uVar6 = (pCVar3->scan).current_row_index;
  bVar4 = (pCVar3->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar6 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (char *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar3->validity = &pvVar5->validity;
      uVar6 = (pCVar3->scan).current_row_index;
    }
    cVar2 = pCVar3->data[(uint)((int)lidx - (int)uVar6)];
    bVar4 = TryCast::Operation<signed_char,double>(cVar2,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_58,(duckdb *)(ulong)(uint)(int)cVar2,input);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar6 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (char *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar3->validity = &pvVar5->validity;
      uVar6 = (pCVar3->scan).current_row_index;
    }
    cVar2 = pCVar3->data[(uint)((int)lidx - (int)uVar6)];
    bVar4 = TryCast::Operation<signed_char,double>(cVar2,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_58,(duckdb *)(ulong)(uint)(int)cVar2,input_00);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_38 = local_60;
    pCVar3 = accessor->data;
    uVar6 = (pCVar3->scan).current_row_index;
    if ((pCVar3->scan).next_row_index <= hidx || hidx < uVar6) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,hidx,&pCVar3->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (char *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar3->validity = &pvVar5->validity;
      uVar6 = (pCVar3->scan).current_row_index;
    }
    cVar2 = pCVar3->data[(uint)((int)hidx - (int)uVar6)];
    bVar4 = TryCast::Operation<signed_char,double>(cVar2,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_58,(duckdb *)(ulong)(uint)(int)cVar2,input_01);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar8 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar8 * local_60 + local_38 * (1.0 - dVar8);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}